

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>
::MarkAsUnused(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>
               *this,int i)

{
  reference pvVar1;
  
  pvVar1 = std::
           deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>::Container>_>
           ::at(&this->cons_,(long)i);
  if (pvVar1[0x59] == (value_type)0x0) {
    pvVar1[0x59] = (value_type)0x1;
    this->n_bridged_or_unused_ = this->n_bridged_or_unused_ + 1;
  }
  return;
}

Assistant:

void MarkAsUnused(int i) override {
    MarkAsUnused(cons_.at(i), i);
  }